

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O1

void __thiscall Analysis::FlowAnalysis_RHIC(Analysis *this)

{
  pretty_ostream *this_00;
  pointer pcVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  singleParticleSpectra *psVar5;
  singleParticleSpectra **ipart;
  singleParticleSpectra **ppsVar6;
  ulong uVar7;
  double dVar8;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  ParameterReader paraRdr;
  singleParticleSpectra *local_eb0;
  singleParticleSpectra **local_ea8;
  iterator iStack_ea0;
  singleParticleSpectra **local_e98;
  ParameterReader local_e90;
  double local_e60;
  shared_ptr<particleSamples> local_e58;
  shared_ptr<RandomUtil::Random> local_e48;
  shared_ptr<RandomUtil::Random> local_e38;
  shared_ptr<RandomUtil::Random> local_e28;
  shared_ptr<RandomUtil::Random> local_e18;
  shared_ptr<RandomUtil::Random> local_e08;
  shared_ptr<RandomUtil::Random> local_df8;
  shared_ptr<RandomUtil::Random> local_de8;
  shared_ptr<RandomUtil::Random> local_dd8;
  shared_ptr<RandomUtil::Random> local_dc8;
  shared_ptr<RandomUtil::Random> local_db8;
  shared_ptr<RandomUtil::Random> local_da8;
  shared_ptr<RandomUtil::Random> local_d98;
  shared_ptr<RandomUtil::Random> local_d88;
  shared_ptr<RandomUtil::Random> local_d78;
  shared_ptr<RandomUtil::Random> local_d68;
  shared_ptr<RandomUtil::Random> local_d58;
  shared_ptr<RandomUtil::Random> local_d48;
  shared_ptr<RandomUtil::Random> local_d38;
  shared_ptr<RandomUtil::Random> local_d28;
  shared_ptr<RandomUtil::Random> local_d18;
  shared_ptr<RandomUtil::Random> local_d08;
  shared_ptr<RandomUtil::Random> local_cf8;
  shared_ptr<RandomUtil::Random> local_ce8;
  shared_ptr<RandomUtil::Random> local_cd8;
  shared_ptr<RandomUtil::Random> local_cc8;
  shared_ptr<RandomUtil::Random> local_cb8;
  shared_ptr<RandomUtil::Random> local_ca8;
  shared_ptr<RandomUtil::Random> local_c98;
  shared_ptr<RandomUtil::Random> local_c88;
  shared_ptr<RandomUtil::Random> local_c78;
  shared_ptr<RandomUtil::Random> local_c68;
  ulong local_c58;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e90.names,&(this->paraRdr_).names);
  std::vector<double,_std::allocator<double>_>::vector(&local_e90.values,&(this->paraRdr_).values);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"compute_correlation","");
  dVar8 = ParameterReader::getVal(&local_e90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((int)dVar8 == 1) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"compute_correlation","");
    ParameterReader::setVal(&local_e90,&local_70,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"flag_charge_dependence","");
  dVar8 = ParameterReader::getVal(&local_e90,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((int)dVar8 == 1) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"flag_charge_dependence","")
    ;
    ParameterReader::setVal(&local_e90,&local_b0,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  local_ea8 = (singleParticleSpectra **)0x0;
  iStack_ea0._M_current = (singleParticleSpectra **)0x0;
  local_e98 = (singleParticleSpectra **)0x0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"particle_monval","");
  ParameterReader::setVal(&local_e90,&local_d0,99999.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"rap_type","");
  ParameterReader::setVal(&local_e90,&local_f0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"rapidity_distribution","");
  ParameterReader::setVal(&local_e90,&local_110,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_e90,&local_130,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_e90,&local_150,4.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"rapidityPTDistributionFlag","");
  ParameterReader::setVal(&local_e90,&local_170,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_c68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_c68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_c68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_190,&local_c68);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_c68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"particle_monval","");
  ParameterReader::setVal(&local_e90,&local_1b0,9999.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"rap_type","");
  ParameterReader::setVal(&local_e90,&local_1d0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"rapidity_distribution","");
  ParameterReader::setVal(&local_e90,&local_1f0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_e90,&local_210,0.2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_e90,&local_230,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,"rapidityPTDistributionFlag","");
  ParameterReader::setVal(&local_e90,&local_250,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_c78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_c78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_c78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_270,&local_c78);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_c78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"rapidityPTDistributionFlag","");
  ParameterReader::setVal(&local_e90,&local_290,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"rap_min","");
  ParameterReader::setVal(&local_e90,&local_2b0,-0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"rap_max","");
  ParameterReader::setVal(&local_e90,&local_2d0,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_c88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_c88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_c88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_2f0,&local_c88);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_c88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"rap_min","");
  ParameterReader::setVal(&local_e90,&local_310,-1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"rap_max","");
  ParameterReader::setVal(&local_e90,&local_330,-0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_c98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_c98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_c98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_350,&local_c98);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_c98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"rap_min","");
  ParameterReader::setVal(&local_e90,&local_370,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"rap_max","");
  ParameterReader::setVal(&local_e90,&local_390,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_ca8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_ca8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_ca8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_ca8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_ca8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_ca8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_ca8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_3b0,&local_ca8);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_ca8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ca8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"rap_min","");
  ParameterReader::setVal(&local_e90,&local_3d0,-3.9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"rap_max","");
  ParameterReader::setVal(&local_e90,&local_3f0,-3.1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_410,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_cb8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_cb8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_cb8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_cb8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_cb8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_cb8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_cb8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_410,&local_cb8);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_cb8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"rap_min","");
  ParameterReader::setVal(&local_e90,&local_430,3.1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"rap_max","");
  ParameterReader::setVal(&local_e90,&local_450,3.9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_470,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_cc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_cc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_cc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_cc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_cc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_cc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_cc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_470,&local_cc8);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_cc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_e90,&local_490,0.2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_e90,&local_4b0,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4d0,"pidwithRapidityPTDistribution","");
  dVar8 = ParameterReader::getVal(&local_e90,&local_4d0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    local_e60 = dVar8;
    operator_delete(local_4d0._M_dataplus._M_p);
    dVar8 = local_e60;
  }
  if ((dVar8 == 1.0) && (!NAN(dVar8))) {
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4f0,"rapidityPTDistributionFlag","");
    ParameterReader::setVal(&local_e90,&local_4f0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p);
    }
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"rap_type","");
    ParameterReader::setVal(&local_e90,&local_510,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p);
    }
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_530,211.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_550,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_cd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_cd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_cd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_cd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_cd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_cd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_cd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_550,&local_cd8);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_cd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_cd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p);
    }
    local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_570,-211.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      operator_delete(local_570._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_590,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_ce8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_ce8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_ce8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_ce8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_ce8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_ce8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_ce8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_590,&local_ce8);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_ce8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_ce8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_5b0,321.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5d0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_cf8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_cf8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_cf8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_cf8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_cf8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_cf8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_cf8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_5d0,&local_cf8);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_cf8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_cf8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
      operator_delete(local_5d0._M_dataplus._M_p);
    }
    local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_5f0,-321.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
      operator_delete(local_5f0._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_610,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_d08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_d08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_d08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_d08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_d08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_610,&local_d08);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_d08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_dataplus._M_p != &local_610.field_2) {
      operator_delete(local_610._M_dataplus._M_p);
    }
    local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_630,2212.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != &local_630.field_2) {
      operator_delete(local_630._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_650,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_d18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_d18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_d18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_d18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_d18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_650,&local_d18);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_d18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p != &local_650.field_2) {
      operator_delete(local_650._M_dataplus._M_p);
    }
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_670,-2212.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_690,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_d28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_d28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_d28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_d28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_d28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_690,&local_d28);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_d28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p);
    }
  }
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"rap_type","");
  ParameterReader::setVal(&local_e90,&local_6b0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p);
  }
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"rapidity_distribution","");
  ParameterReader::setVal(&local_e90,&local_6d0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p);
  }
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"rap_min","");
  ParameterReader::setVal(&local_e90,&local_6f0,-0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p);
  }
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"rap_max","");
  ParameterReader::setVal(&local_e90,&local_710,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p);
  }
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"particle_monval","");
  ParameterReader::setVal(&local_e90,&local_730,211.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_750,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_d38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_d38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_d38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_750,&local_d38);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_d38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p);
  }
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"particle_monval","");
  ParameterReader::setVal(&local_e90,&local_770,-211.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_790,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_d48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_d48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_d48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_790,&local_d48);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_d48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p);
  }
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"particle_monval","");
  ParameterReader::setVal(&local_e90,&local_7b0,321.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7d0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_d58.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_d58.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_d58.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d58.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d58.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d58.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d58.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_7d0,&local_d58);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_d58.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d58.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"particle_monval","");
  ParameterReader::setVal(&local_e90,&local_7f0,-321.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_810,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_d68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_d68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_d68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_810,&local_d68);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_d68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d68.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"particle_monval","");
  ParameterReader::setVal(&local_e90,&local_830,2212.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_850,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_d78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_d78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_d78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_850,&local_d78);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_d78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d78.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    operator_delete(local_850._M_dataplus._M_p);
  }
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"particle_monval","");
  ParameterReader::setVal(&local_e90,&local_870,-2212.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_890,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_d88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_d88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_d88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_890,&local_d88);
  local_eb0 = psVar5;
  if (iStack_ea0._M_current == local_e98) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8,
               iStack_ea0,&local_eb0);
  }
  else {
    *iStack_ea0._M_current = psVar5;
    iStack_ea0._M_current = iStack_ea0._M_current + 1;
  }
  if (local_d88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d88.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p);
  }
  local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8b0,"resonance_weak_feed_down_flag","");
  dVar8 = ParameterReader::getVal(&local_e90,&local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    local_e60 = dVar8;
    operator_delete(local_8b0._M_dataplus._M_p);
    dVar8 = local_e60;
  }
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_8d0,3122.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
      operator_delete(local_8d0._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8f0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_d98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_d98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_d98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_d98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_d98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_8f0,&local_d98);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_d98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d98.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
      operator_delete(local_8f0._M_dataplus._M_p);
    }
    local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_910,-3122.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_910._M_dataplus._M_p != &local_910.field_2) {
      operator_delete(local_910._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_930,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_da8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_da8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_da8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_da8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_da8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_da8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_da8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_930,&local_da8);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_da8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_da8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_930._M_dataplus._M_p != &local_930.field_2) {
      operator_delete(local_930._M_dataplus._M_p);
    }
    local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_950,3312.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_950._M_dataplus._M_p != &local_950.field_2) {
      operator_delete(local_950._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_970,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_db8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_db8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_db8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_db8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_db8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_db8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_db8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_970,&local_db8);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_db8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_db8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_970._M_dataplus._M_p != &local_970.field_2) {
      operator_delete(local_970._M_dataplus._M_p);
    }
    local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_990,-3312.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_990._M_dataplus._M_p != &local_990.field_2) {
      operator_delete(local_990._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9b0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_dc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_dc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_dc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_dc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_dc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_dc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_dc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_9b0,&local_dc8);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_dc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_dc8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
      operator_delete(local_9b0._M_dataplus._M_p);
    }
    local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_9d0,3334.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
      operator_delete(local_9d0._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9f0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_dd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_dd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_dd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_dd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_dd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_dd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_dd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_9f0,&local_dd8);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_dd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_dd8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
      operator_delete(local_9f0._M_dataplus._M_p);
    }
    local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_a10,-3334.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
      operator_delete(local_a10._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a30,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_de8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_de8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_de8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_de8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_de8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_de8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_de8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_a30,&local_de8);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_de8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_de8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
      operator_delete(local_a30._M_dataplus._M_p);
    }
    local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a50,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_a50,333.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
      operator_delete(local_a50._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a70,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_df8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_df8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_df8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_df8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_df8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_df8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_df8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_a70,&local_df8);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_df8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_df8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
      operator_delete(local_a70._M_dataplus._M_p);
    }
  }
  local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a90,"collect_neutral_particles","");
  dVar8 = ParameterReader::getVal(&local_e90,&local_a90,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
    local_e60 = dVar8;
    operator_delete(local_a90._M_dataplus._M_p);
    dVar8 = local_e60;
  }
  if ((dVar8 == 1.0) && (!NAN(dVar8))) {
    local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab0,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_ab0,111.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
      operator_delete(local_ab0._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ad0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_e08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_e08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_e08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_ad0,&local_e08);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_e08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e08.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
      operator_delete(local_ad0._M_dataplus._M_p);
    }
    local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_af0,311.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
      operator_delete(local_af0._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b10,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_e18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_e18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_e18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_b10,&local_e18);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_e18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e18.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
      operator_delete(local_b10._M_dataplus._M_p);
    }
    local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_b30,-311.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
      operator_delete(local_b30._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b50,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_e28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_e28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_e28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_b50,&local_e28);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_e28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e28.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
      operator_delete(local_b50._M_dataplus._M_p);
    }
    local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b70,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_b70,2112.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
      operator_delete(local_b70._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b90,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_e38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_e38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_e38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_b90,&local_e38);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_e38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e38.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
      operator_delete(local_b90._M_dataplus._M_p);
    }
    local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"particle_monval","");
    ParameterReader::setVal(&local_e90,&local_bb0,-2112.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
      operator_delete(local_bb0._M_dataplus._M_p);
    }
    psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_bd0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_e48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_e48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_e48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar5,&local_e90,&local_bd0,&local_e48);
    local_eb0 = psVar5;
    if (iStack_ea0._M_current == local_e98) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_ea8
                 ,iStack_ea0,&local_eb0);
    }
    else {
      *iStack_ea0._M_current = psVar5;
      iStack_ea0._M_current = iStack_ea0._M_current + 1;
    }
    if (local_e48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e48.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
      operator_delete(local_bd0._M_dataplus._M_p);
    }
  }
  this_00 = &this->messager;
  uVar7 = 0;
  while( true ) {
    bVar3 = particleSamples::end_of_file
                      ((this->particle_list_).
                       super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar2._M_current = iStack_ea0._M_current;
    ppsVar6 = local_ea8;
    if (bVar3) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Reading event: ",0xf);
    std::ostream::operator<<(this_00,(int)uVar7 + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ... ",5);
    local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf0,"info","");
    pretty_ostream::flush(this_00,&local_bf0);
    local_c58 = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
      operator_delete(local_bf0._M_dataplus._M_p);
    }
    iVar4 = particleSamples::read_in_particle_samples
                      ((this->particle_list_).
                       super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_e60 = (double)CONCAT44(local_e60._4_4_,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"nev = ",6);
    std::ostream::operator<<(this_00,local_e60._0_4_);
    local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"info","");
    pretty_ostream::flush(this_00,&local_c10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
      operator_delete(local_c10._M_dataplus._M_p);
    }
    local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50," processing ...","");
    pretty_ostream::info(this_00,&local_c50);
    ppsVar6 = local_ea8;
    iVar2._M_current = iStack_ea0._M_current;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
      operator_delete(local_c50._M_dataplus._M_p);
      ppsVar6 = local_ea8;
      iVar2._M_current = iStack_ea0._M_current;
    }
    for (; ppsVar6 != iVar2._M_current; ppsVar6 = ppsVar6 + 1) {
      particleSamples::filter_particles_from_events
                ((this->particle_list_).
                 super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (*ppsVar6)->particle_monval);
      psVar5 = *ppsVar6;
      local_e58.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->particle_list_).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_e58.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->particle_list_).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_e58.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_e58.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_e58.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_e58.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_e58.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      singleParticleSpectra::calculate_Qn_vector_shell(psVar5,&local_e58);
      if (local_e58.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e58.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"done!","");
    pretty_ostream::info(this_00,&local_c30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
      operator_delete(local_c30._M_dataplus._M_p);
    }
    uVar7 = (ulong)(uint)(local_e60._0_4_ + (int)local_c58);
  }
  for (; ppsVar6 != iVar2._M_current; ppsVar6 = ppsVar6 + 1) {
    singleParticleSpectra::output_spectra_and_Qn_results(*ppsVar6);
  }
  if (iStack_ea0._M_current != local_ea8) {
    iStack_ea0._M_current = local_ea8;
  }
  if (local_ea8 != (singleParticleSpectra **)0x0) {
    operator_delete(local_ea8);
  }
  ParameterReader::~ParameterReader(&local_e90);
  return;
}

Assistant:

void Analysis::FlowAnalysis_RHIC() {
    ParameterReader paraRdr = paraRdr_;
    int compute_correlation = paraRdr.getVal("compute_correlation");
    if (compute_correlation == 1) paraRdr.setVal("compute_correlation", 0);
    int flag_charge_dependence = paraRdr.getVal("flag_charge_dependence");
    if (flag_charge_dependence == 1)
        paraRdr.setVal("flag_charge_dependence", 0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;

    // all hadrons (99999) first (collect E_T)
    paraRdr.setVal("particle_monval", 99999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // charged hadron first
    paraRdr.setVal("particle_monval", 9999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // speical triggers follows
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // STAR rapidity cut
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // PHENIX BBC
    paraRdr.setVal("rap_min", -3.9);
    paraRdr.setVal("rap_max", -3.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 3.1);
    paraRdr.setVal("rap_max", 3.9);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // now identified particle
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    if (paraRdr.getVal("pidwithRapidityPTDistribution", 0) == 1) {
        paraRdr.setVal("rapidityPTDistributionFlag", 1);
        paraRdr.setVal("rap_type", 1);
        paraRdr.setVal("particle_monval", 211);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -211);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 321);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -321);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 2212);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -2212);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("particle_monval", 211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    if (paraRdr.getVal("resonance_weak_feed_down_flag") == 0) {
        paraRdr.setVal("particle_monval", 3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 333);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    if (paraRdr.getVal("collect_neutral_particles", 0) == 1) {
        paraRdr.setVal("particle_monval", 111);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}